

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBuilderTests.cpp
# Opt level: O3

void __thiscall
agge::tests::LayoutBuilderTests::TrimmingSingleRangeRestoresExtentAndGlyphs
          (LayoutBuilderTests *this)

{
  text_lines_container_t *text_lines;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *pvVar1;
  long lVar2;
  positioned_glyph *ppVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  vector_r vVar7;
  iterator __position;
  real_t rVar8;
  FailedAssertion *pFVar9;
  ulong uVar10;
  vector_r vVar11;
  _Alloc_hider _Var12;
  float *pfVar13;
  uint uVar14;
  float fVar15;
  const_iterator i;
  state s2;
  state s1;
  undefined1 local_388 [24];
  vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> avStack_370 [8];
  iterator local_368;
  positioned_glyph *ppStack_360;
  bool local_358;
  undefined1 local_350 [4];
  float fStack_34c;
  float fStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [16];
  pointer local_330;
  pointer ppStack_328;
  bool local_320;
  glyph_runs_container_t *local_318;
  undefined1 local_310 [4];
  float fStack_30c;
  float local_308;
  undefined4 uStack_304;
  undefined1 local_300 [16];
  undefined1 uStack_2f0;
  undefined7 uStack_2ef;
  undefined1 local_2e8;
  undefined7 uStack_2e7;
  bool bStack_2e0;
  undefined1 local_2d8 [8];
  pointer prStack_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8 [2];
  ref_text_line local_2a8;
  ref_text_line local_280;
  string local_258;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_218;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_200;
  uint local_1e8 [2];
  LocationInfo local_1e0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_1b8;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_1a0;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_188;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_170;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_158;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_128;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_110;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_98;
  state local_78;
  state local_70;
  layout_builder local_68;
  
  local_318 = &this->glyph_runs;
  text_lines = &this->text_lines;
  layout_builder::layout_builder(&local_68,&this->glyphs,local_318,text_lines);
  layout_builder::begin_style(&local_68,&this->font2);
  ppVar3 = (local_68._glyphs)->_begin;
  ppVar3[local_68._state.next].index = 0xb;
  ppVar3[local_68._state.next].d.dx = 3.0;
  ppVar3[local_68._state.next].d.dy = 0.0;
  uVar14 = local_68._state.next + 2;
  ppVar3[local_68._state.next + 1].index = 0xc;
  ppVar3[local_68._state.next + 1].d.dx = 5.3;
  ppVar3[local_68._state.next + 1].d.dy = 0.0;
  local_68._state.extent = local_68._state.extent + 3.0 + 5.3;
  local_70.next = uVar14;
  local_70.extent = local_68._state.extent;
  local_68._state.next = local_68._state.next + 3;
  ppVar3[uVar14].index = 0xd;
  ppVar3[uVar14].d.dx = 3.1;
  ppVar3[uVar14].d.dy = 0.0;
  local_68._state.extent = local_68._state.extent + 3.1;
  layout_builder::trim_current_line(&local_68,&local_70);
  local_388._0_8_ = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0xb;
  local_280._offset.dx = 1.68156e-44;
  local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_b0,
             (iterator)
             local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish,(uint *)&local_280);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2d8,&local_b0);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_368._M_current = (positioned_glyph *)0x0;
  ppStack_360 = (positioned_glyph *)0x0;
  local_388._16_4_ = 0.0;
  local_388._20_4_ = 0.0;
  avStack_370 = (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0;
  local_358 = false;
  local_388._8_8_ = p_Var4;
  if (local_2d8 != (undefined1  [8])prStack_2d0) {
    vVar11 = (vector_r)local_2d8;
    do {
      local_350 = *(undefined1 (*) [4])vVar11;
      fStack_34c = 0.0;
      fStack_348 = 0.0;
      if (local_368._M_current == ppStack_360) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  (avStack_370,local_368,(positioned_glyph *)local_350);
      }
      else {
        ((local_368._M_current)->d).dy = 0.0;
        (local_368._M_current)->index = (int)(ulong)(uint)local_350;
        ((local_368._M_current)->d).dx = (float)(int)((ulong)(uint)local_350 >> 0x20);
        local_368._M_current = local_368._M_current + 1;
      }
      vVar11 = (vector_r)((long)vVar11 + 4);
    } while (vVar11 != (vector_r)prStack_2d0);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_2a8,1,(value_type *)local_388,(allocator_type *)local_350);
  _local_310 = (vector_r)local_300;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_310,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_350,(string *)local_310,0x12f);
  ut::
  are_equal<std::vector<agge::tests::ref_glyph_run,std::allocator<agge::tests::ref_glyph_run>>,std::vector<agge::glyph_run,std::allocator<agge::glyph_run>>>
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_2a8,local_318,(LocationInfo *)local_350);
  vVar11.dy = fStack_34c;
  vVar11.dx = (float)local_350;
  if (vVar11 != (vector_r)local_340) {
    operator_delete((void *)vVar11);
  }
  if (_local_310 != (vector_r)local_300) {
    operator_delete((void *)_local_310);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_2a8);
  if (avStack_370 != (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0
     ) {
    operator_delete((void *)avStack_370);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_);
  }
  if ((vector_r)local_2d8 != (vector_r)0x0) {
    operator_delete((void *)local_2d8);
  }
  if (local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  local_2d8._0_4_ = 0.0;
  local_2d8._4_4_ = 0.0;
  prStack_2d0 = (pointer)0x0;
  local_2c8[0]._M_allocated_capacity = (pointer)0x0;
  ref_text_line::ref_text_line
            ((ref_text_line *)local_388,0.0,0.0,0.0,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_2d8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2a8,1,(value_type *)local_388,(allocator_type *)local_350);
  _local_310 = (vector_r)local_300;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_310,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_350,(string *)local_310,0x130);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2a8,text_lines,(LocationInfo *)local_350);
  vVar7.dy = fStack_34c;
  vVar7.dx = (float)local_350;
  if (vVar7 != (vector_r)local_340) {
    operator_delete((void *)vVar7);
  }
  if (_local_310 != (vector_r)local_300) {
    operator_delete((void *)_local_310);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_2a8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             ((long)local_388 + 0x10));
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_2d8);
  rVar8 = local_68._state.extent;
  _local_310 = (vector_r)local_300;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_310,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_388,(string *)local_310,0x131);
  fVar15 = 8.3 - rVar8;
  if (0.001 < ABS((fVar15 + fVar15) / (rVar8 + 8.3))) {
    pFVar9 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    _local_350 = (vector_r)local_340;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_350,"Values are not approximately equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar9,(string *)local_350,(LocationInfo *)local_388);
    __cxa_throw(pFVar9,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if (local_388._0_8_ != (long)local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_);
  }
  if (_local_310 != (vector_r)local_300) {
    operator_delete((void *)_local_310);
  }
  layout_builder::break_current_line(&local_68);
  vVar11 = (vector_r)(this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  p_Var4 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0xb;
  local_1e0.filename._M_dataplus._M_p._0_4_ = 0xc;
  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,
             (iterator)
             local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish,(uint *)&local_1e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_280,&local_c8);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_368._M_current = (positioned_glyph *)0x0;
  ppStack_360 = (positioned_glyph *)0x0;
  local_388._16_4_ = 0.0;
  local_388._20_4_ = 0.0;
  avStack_370 = (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0;
  local_358 = false;
  pfVar13 = (float *)CONCAT44(local_280._offset.dy,local_280._offset.dx);
  local_388._0_8_ = vVar11;
  local_388._8_8_ = p_Var4;
  if (pfVar13 != (float *)CONCAT44(local_280._12_4_,local_280._extent)) {
    do {
      local_350 = (undefined1  [4])*pfVar13;
      fStack_34c = 0.0;
      fStack_348 = 0.0;
      if (local_368._M_current == ppStack_360) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  (avStack_370,local_368,(positioned_glyph *)local_350);
      }
      else {
        ((local_368._M_current)->d).dy = 0.0;
        (local_368._M_current)->index = (int)(ulong)(uint)local_350;
        ((local_368._M_current)->d).dx = (float)(int)((ulong)(uint)local_350 >> 0x20);
        local_368._M_current = local_368._M_current + 1;
      }
      pfVar13 = pfVar13 + 1;
    } while (pfVar13 != (float *)CONCAT44(local_280._12_4_,local_280._extent));
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_140,1,(value_type *)local_388,(allocator_type *)local_350);
  peVar5 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  local_350 = SUB84(peVar5,0);
  fStack_34c = (float)((ulong)peVar5 >> 0x20);
  if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    fStack_348 = 0.0;
    uStack_344 = 0;
  }
  else {
    fStack_348 = SUB84(p_Var6,0);
    uStack_344 = (undefined4)((ulong)p_Var6 >> 0x20);
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
        goto LAB_00148096;
      }
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
  }
LAB_00148096:
  local_330 = (pointer)0x0;
  ppStack_328 = (pointer)0x0;
  local_340._0_8_ = 0;
  local_340._8_8_ = (void *)0x0;
  local_320 = false;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::push_back
            (&local_140,(value_type *)local_350);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_2d8,&local_140);
  pvVar1 = &local_2a8._glyph_runs;
  local_2a8._offset = (vector_r)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_310,(string *)&local_2a8,0x13a);
  ut::
  are_equal<std::vector<agge::tests::ref_glyph_run,std::allocator<agge::tests::ref_glyph_run>>,std::vector<agge::glyph_run,std::allocator<agge::glyph_run>>>
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_2d8,local_318,(LocationInfo *)local_310);
  if (_local_310 != (vector_r)local_300) {
    operator_delete((void *)_local_310);
  }
  if (local_2a8._offset != (vector_r)pvVar1) {
    operator_delete((void *)local_2a8._offset);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_2d8);
  if ((void *)local_340._8_8_ != (void *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_344,fStack_348) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_344,fStack_348));
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_140);
  if (avStack_370 != (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0
     ) {
    operator_delete((void *)avStack_370);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_);
  }
  if ((void *)CONCAT44(local_280._offset.dy,local_280._offset.dx) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_280._offset.dy,local_280._offset.dx));
  }
  if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  vVar11 = (vector_r)(this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  p_Var4 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0xb;
  local_1a0.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xc;
  local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_e0,
             (iterator)
             local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish,(uint *)&local_1a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_258,&local_e0);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_368._M_current = (positioned_glyph *)0x0;
  ppStack_360 = (positioned_glyph *)0x0;
  local_388._16_4_ = 0.0;
  local_388._20_4_ = 0.0;
  avStack_370 = (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0;
  local_358 = false;
  local_388._0_8_ = vVar11;
  local_388._8_8_ = p_Var4;
  if (local_258._M_dataplus._M_p != (pointer)local_258._M_string_length) {
    _Var12._M_p = local_258._M_dataplus._M_p;
    do {
      local_310 = *(undefined1 (*) [4])_Var12._M_p;
      fStack_30c = 0.0;
      local_308 = 0.0;
      if (local_368._M_current == ppStack_360) {
        std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
        _M_realloc_insert<agge::positioned_glyph_const&>
                  (avStack_370,local_368,(positioned_glyph *)local_310);
      }
      else {
        ((local_368._M_current)->d).dy = 0.0;
        (local_368._M_current)->index = (int)(ulong)(uint)local_310;
        ((local_368._M_current)->d).dx = (float)(int)((ulong)(uint)local_310 >> 0x20);
        local_368._M_current = local_368._M_current + 1;
      }
      _Var12._M_p = _Var12._M_p + 4;
    } while (_Var12._M_p != (pointer)local_258._M_string_length);
  }
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_1e0,1,(value_type *)local_388,(allocator_type *)local_310);
  ref_text_line::ref_text_line
            ((ref_text_line *)local_350,0.0,11.0,8.3,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_1e0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_158,1,(value_type *)local_350,(allocator_type *)local_310);
  local_238.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ref_text_line::ref_text_line((ref_text_line *)local_310,0.0,19.3,0.0,&local_238);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_158,(value_type *)local_310);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_280,&local_158);
  local_2d8 = (undefined1  [8])local_2c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)&local_2a8,(string *)local_2d8,0x13f);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_280,text_lines,(LocationInfo *)&local_2a8);
  if (local_2a8._offset != (vector_r)pvVar1) {
    operator_delete((void *)local_2a8._offset);
  }
  if (local_2d8 != (undefined1  [8])local_2c8) {
    operator_delete((void *)local_2d8);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_280);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_300);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_238);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_158);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             local_340);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_1e0);
  if (avStack_370 != (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0
     ) {
    operator_delete((void *)avStack_370);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_);
  }
  if ((uint *)local_258._M_dataplus._M_p != (uint *)0x0) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  uVar10 = (ulong)local_68._state.next;
  local_68._state.next = local_68._state.next + 1;
  ppVar3 = (local_68._glyphs)->_begin;
  ppVar3[uVar10].index = 0xe;
  ppVar3 = ppVar3 + uVar10;
  (ppVar3->d).dx = 5.7;
  (ppVar3->d).dy = 0.0;
  local_68._state.extent = local_68._state.extent + 5.7;
  layout_builder::begin_style(&local_68,&this->font1);
  ppVar3 = (local_68._glyphs)->_begin;
  ppVar3[local_68._state.next].index = 0xf;
  ppVar3[local_68._state.next].d.dx = 3.2;
  ppVar3[local_68._state.next].d.dy = 0.0;
  uVar14 = local_68._state.next + 2;
  ppVar3[local_68._state.next + 1].index = 0x10;
  local_68._state.extent = local_68._state.extent + 3.2 + 2.9;
  ppVar3[local_68._state.next + 1].d.dx = 2.9;
  ppVar3[local_68._state.next + 1].d.dy = 0.0;
  local_78.next = uVar14;
  local_78.extent = local_68._state.extent;
  local_68._state.next = local_68._state.next + 3;
  ppVar3 = (local_68._glyphs)->_begin;
  ppVar3[uVar14].index = 0x11;
  ppVar3 = ppVar3 + uVar14;
  (ppVar3->d).dx = 3.6;
  (ppVar3->d).dy = 0.0;
  local_68._state.extent = local_68._state.extent + 3.6;
  layout_builder::trim_current_line(&local_68,&local_78);
  local_318 = (glyph_runs_container_t *)CONCAT44(local_318._4_4_,local_68._state.extent);
  _local_310 = (vector_r)local_300;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_310,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_388,(string *)local_310,0x14d);
  if (ABS(((11.8 - local_318._0_4_) + (11.8 - local_318._0_4_)) / (local_318._0_4_ + 11.8)) <= 0.001
     ) {
    if (local_388._0_8_ != (long)local_388 + 0x10) {
      operator_delete((void *)local_388._0_8_);
    }
    if (_local_310 != (vector_r)local_300) {
      operator_delete((void *)_local_310);
    }
    layout_builder::break_current_line(&local_68);
    vVar11 = (vector_r)
             (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    *local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = 0xb;
    local_1e8[1] = 0xc;
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_f8,
               (iterator)
               local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_1e8 + 1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_200,&local_f8);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    local_368._M_current = (positioned_glyph *)0x0;
    ppStack_360 = (positioned_glyph *)0x0;
    local_388._16_4_ = 0.0;
    local_388._20_4_ = 0.0;
    avStack_370 = (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0;
    local_358 = false;
    local_388._0_8_ = vVar11;
    local_388._8_8_ = p_Var4;
    if (local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pfVar13 = (float *)local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      do {
        local_350 = (undefined1  [4])*pfVar13;
        fStack_34c = 0.0;
        fStack_348 = 0.0;
        if (local_368._M_current == ppStack_360) {
          std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
          _M_realloc_insert<agge::positioned_glyph_const&>
                    (avStack_370,local_368,(positioned_glyph *)local_350);
        }
        else {
          ((local_368._M_current)->d).dy = 0.0;
          (local_368._M_current)->index = (int)(ulong)(uint)local_350;
          ((local_368._M_current)->d).dx = (float)(int)((ulong)(uint)local_350 >> 0x20);
          local_368._M_current = local_368._M_current + 1;
        }
        pfVar13 = pfVar13 + 1;
      } while (pfVar13 !=
               (float *)local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
    }
    std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
              (&local_1a0,1,(value_type *)local_388,(allocator_type *)local_350);
    ref_text_line::ref_text_line(&local_2a8,0.0,11.0,8.3,&local_1a0);
    std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
              (&local_188,1,&local_2a8,(allocator_type *)local_350);
    peVar5 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var6 = (this->font2).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    local_318 = (glyph_runs_container_t *)operator_new(4);
    *(float *)local_318 = 1.96182e-44;
    local_350 = SUB84(peVar5,0);
    fStack_34c = (float)((ulong)peVar5 >> 0x20);
    fStack_348 = SUB84(p_Var6,0);
    uStack_344 = (undefined4)((ulong)p_Var6 >> 0x20);
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
    local_330 = (pointer)0x0;
    ppStack_328 = (pointer)0x0;
    local_340._0_8_ = 0;
    local_340._8_8_ = (void *)0x0;
    local_320 = false;
    local_310 = *(undefined1 (*) [4])local_318;
    fStack_30c = 0.0;
    local_308 = 0.0;
    std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
    _M_realloc_insert<agge::positioned_glyph_const&>
              ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
               (local_340 + 8),(iterator)0x0,(positioned_glyph *)local_310);
    std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
              (&local_1b8,1,(value_type *)local_350,(allocator_type *)local_310);
    peVar5 = (this->font1).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->font1).super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    *local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_start = 0xf;
    local_1e8[0] = 0x10;
    local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_128,
               (iterator)
               local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_1e8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_218,&local_128);
    local_310 = SUB84(peVar5,0);
    fStack_30c = (float)((ulong)peVar5 >> 0x20);
    local_308 = SUB84(this_00,0);
    uStack_304 = (undefined4)((ulong)this_00 >> 0x20);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_300._0_8_ = 0x40b66666;
    local_300._8_8_ = (void *)0x0;
    uStack_2f0 = 0;
    uStack_2ef = 0;
    local_2e8 = 0;
    uStack_2e7 = 0;
    bStack_2e0 = false;
    if (local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pfVar13 = (float *)local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      do {
        local_280._offset.dx = *pfVar13;
        local_280._offset.dy = 0.0;
        local_280._extent = 0.0;
        __position._M_current._1_7_ = uStack_2ef;
        __position._M_current._0_1_ = uStack_2f0;
        if (__position._M_current == (positioned_glyph *)CONCAT71(uStack_2e7,local_2e8)) {
          std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
          _M_realloc_insert<agge::positioned_glyph_const&>
                    ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)
                     (local_300 + 8),__position,(positioned_glyph *)&local_280);
        }
        else {
          ((__position._M_current)->d).dy = 0.0;
          (__position._M_current)->index = (int)(ulong)(uint)local_280._offset.dx;
          ((__position._M_current)->d).dx = (float)(int)((ulong)(uint)local_280._offset.dx >> 0x20);
          lVar2 = CONCAT71(uStack_2ef,uStack_2f0) + 0xc;
          uStack_2f0 = (undefined1)lVar2;
          uStack_2ef = (undefined7)((ulong)lVar2 >> 8);
        }
        pfVar13 = pfVar13 + 1;
      } while (pfVar13 !=
               (float *)local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
    }
    std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::push_back
              (&local_1b8,(value_type *)local_310);
    std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
              (&local_110,&local_1b8);
    ref_text_line::ref_text_line((ref_text_line *)local_2d8,0.0,30.3,11.8,&local_110);
    std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
              (&local_188,(value_type *)local_2d8);
    std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
              (&local_170,&local_188);
    local_98.
    super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ref_text_line::ref_text_line(&local_280,0.0,38.6,0.0,&local_98);
    std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
              (&local_170,&local_280);
    std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
              ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
               &local_238,&local_170);
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutBuilderTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo(&local_1e0,&local_258,0x15a);
    ut::
    are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
              ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
               &local_238,text_lines,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1e0.filename._M_dataplus._M_p._4_4_,
                    local_1e0.filename._M_dataplus._M_p._0_4_) != &local_1e0.filename.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1e0.filename._M_dataplus._M_p._4_4_,
                               local_1e0.filename._M_dataplus._M_p._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
              ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
               &local_238);
    std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
              (&local_280._glyph_runs);
    std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
              (&local_98);
    std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
              (&local_170);
    std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
              ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
               local_2c8);
    std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
              (&local_110);
    if ((void *)local_300._8_8_ != (void *)0x0) {
      operator_delete((void *)local_300._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_304,local_308) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_304,local_308));
    }
    if ((float *)local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start != (float *)0x0) {
      operator_delete(local_218.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
              (&local_1b8);
    if ((void *)local_340._8_8_ != (void *)0x0) {
      operator_delete((void *)local_340._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_344,fStack_348) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_344,fStack_348));
    }
    operator_delete(local_318);
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
    std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
              (&local_188);
    std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
              (&local_2a8._glyph_runs);
    std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
              (&local_1a0);
    if (avStack_370 !=
        (vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>  [8])0x0) {
      operator_delete((void *)avStack_370);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_388._8_8_);
    }
    if ((float *)local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start != (float *)0x0) {
      operator_delete(local_200.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    return;
  }
  pFVar9 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  _local_350 = (vector_r)local_340;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_350,"Values are not approximately equal!","");
  ut::FailedAssertion::FailedAssertion(pFVar9,(string *)local_350,(LocationInfo *)local_388);
  __cxa_throw(pFVar9,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( TrimmingSingleRangeRestoresExtentAndGlyphs )
			{
				// INIT
				layout_builder m(glyphs, glyph_runs, text_lines);

				m.begin_style(font2);
				m.append_glyph(11, 3.0f);
				m.append_glyph(12, 5.3f);
				layout_builder::state s1 = m.get_state();
				m.append_glyph(13, 3.1f);

				// ACT
				m.trim_current_line(s1);

				// ASSERT
				assert_equal(plural + ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u), glyph_runs);
				assert_equal(plural + ref_text_line(0.0f, 0.0f, 0.0f, vector<ref_glyph_run>()), text_lines);
				assert_approx_equal(8.3f, m.get_state().extent, 0.001);

				// ACT
				m.break_current_line();

				// ASSERT
				assert_equal(plural
					+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u)
					+ ref_glyph_run(font2, 0.0f, 0.0f, vector<glyph_index_t>()),
					glyph_runs);
				assert_equal(plural
					+ ref_text_line(0.0f, 11.0f, 8.3f, plural
						+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u))
					+ ref_text_line(0.0f, 19.3f, 0.0f, vector<ref_glyph_run>()),
					text_lines);

				// INIT
				m.append_glyph(14, 5.7f);
				m.begin_style(font1);
				m.append_glyph(15, 3.2f);
				m.append_glyph(16, 2.9f);
				layout_builder::state s2 = m.get_state();
				m.append_glyph(17, 3.6f);

				// ACT
				m.trim_current_line(s2);

				//ASSERT
				assert_approx_equal(11.8f, m.get_state().extent, 0.001);

				// ACT
				m.break_current_line();

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 11.0f, 8.3f, plural
						+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 11u + 12u))
					+ ref_text_line(0.0f, 30.3f, 11.8f, plural
						+ ref_glyph_run(font2, 0.0f, 0.0f, plural + 14u)
						+ ref_glyph_run(font1, 5.7f, 0.0f, plural + 15u + 16u))
					+ ref_text_line(0.0f, 38.6f, 0.0f, vector<ref_glyph_run>()),
					text_lines);
			}